

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bplustree.cpp
# Opt level: O2

void __thiscall
BPlusTree::InsertInternal
          (BPlusTree *this,float key,shared_ptr<Node> *parent,shared_ptr<Node> *child)

{
  pointer *this_00;
  element_type *peVar1;
  pointer pfVar2;
  ulong uVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  __normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_> __first;
  shared_ptr<Node> *this_01;
  difference_type __d;
  long lVar8;
  undefined1 local_168 [8];
  vector<float,_std::allocator<float>_> firstHalfKey;
  undefined1 local_148 [16];
  undefined1 local_138 [8];
  __shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2> local_130;
  undefined1 local_120 [8];
  vector<float,_std::allocator<float>_> secondHalfKey;
  vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_> firstHalfPtr;
  vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_> secondHalfPtr;
  vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_> tempPtrs;
  shared_ptr<void> internalNode2Ptr;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a8;
  undefined1 local_a0 [8];
  shared_ptr<void> newPointer;
  shared_ptr<void> internalNode1Ptr;
  shared_ptr<Node> newInternalNode;
  shared_ptr<Node> newRoot;
  undefined1 auStack_58 [4];
  float newParentKey;
  vector<float,_std::allocator<float>_> tempKeys;
  float local_38;
  float local_34;
  float key_local;
  
  local_38 = key;
  local_34 = key;
  std::__shared_ptr<void,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<Node,void>
            ((__shared_ptr<void,(__gnu_cxx::_Lock_policy)2> *)local_a0,
             &child->super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>);
  peVar1 = (parent->super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  pfVar2 = (peVar1->keys).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = (long)(peVar1->keys).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pfVar2 >> 2;
  if (uVar3 < this->size) {
    uVar6 = 0xffffffffffffffff;
    for (uVar7 = 0; iVar5 = (int)uVar6, uVar3 != uVar7; uVar7 = uVar7 + 1) {
      if (local_34 < pfVar2[uVar7]) {
        iVar5 = (int)uVar7;
        goto LAB_001044a9;
      }
      if (uVar3 - 1 == uVar7) {
        uVar6 = uVar3;
      }
      uVar6 = uVar6 & 0xffffffff;
    }
    if (iVar5 != -1) {
LAB_001044a9:
      std::vector<float,_std::allocator<float>_>::insert
                (&peVar1->keys,(const_iterator)(pfVar2 + iVar5),&local_38);
      peVar1 = (parent->super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      std::vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>::insert
                (&peVar1->ptrs,
                 (peVar1->ptrs).
                 super__Vector_base<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>.
                 _M_impl.super__Vector_impl_data._M_start + (long)iVar5 + 1,(value_type *)local_a0);
    }
  }
  else {
    auStack_58[0] = 0;
    std::make_shared<Node,bool,unsigned_int&>
              ((bool *)&internalNode1Ptr.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,(uint *)auStack_58);
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)auStack_58,
               &((parent->super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->keys);
    std::vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>::vector
              ((vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_> *)
               &secondHalfPtr.
                super__Vector_base<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,
               &((parent->super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->ptrs);
    __first._M_current = (float *)CONCAT71(stack0xffffffffffffffa9,auStack_58[0]);
    lVar8 = (long)tempKeys.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start - (long)__first._M_current >> 2;
    for (lVar4 = 0; lVar8 != lVar4; lVar4 = lVar4 + 1) {
      if (local_38 < __first._M_current[lVar4]) {
LAB_001044ec:
        std::vector<float,_std::allocator<float>_>::insert
                  ((vector<float,_std::allocator<float>_> *)auStack_58,
                   (const_iterator)(__first._M_current + (int)lVar4),&local_38);
        std::vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>::insert
                  ((vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_> *)
                   &secondHalfPtr.
                    super__Vector_base<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   secondHalfPtr.
                   super__Vector_base<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + (long)(int)lVar4 + 1,
                   (value_type *)local_a0);
        __first._M_current = (float *)CONCAT71(stack0xffffffffffffffa9,auStack_58[0]);
        lVar8 = (long)tempKeys.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start - (long)__first._M_current >> 2;
        break;
      }
      if (lVar8 + -1 == lVar4) {
        lVar4 = lVar8;
        if ((int)((ulong)~((long)tempKeys.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                 super__Vector_impl_data._M_start - (long)__first._M_current) >> 2)
            != 0) goto LAB_001044ec;
        break;
      }
    }
    uVar3 = lVar8 + 1U >> 1;
    std::vector<float,std::allocator<float>>::
    vector<__gnu_cxx::__normal_iterator<float_const*,std::vector<float,std::allocator<float>>>,void>
              ((vector<float,std::allocator<float>> *)local_168,__first,
               (__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>)
               (__first._M_current + uVar3),(allocator_type *)local_120);
    std::vector<float,std::allocator<float>>::
    vector<__gnu_cxx::__normal_iterator<float_const*,std::vector<float,std::allocator<float>>>,void>
              ((vector<float,std::allocator<float>> *)local_120,
               (float *)(CONCAT71(stack0xffffffffffffffa9,auStack_58[0]) + uVar3 * 4 + 4),
               (__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>)
               tempKeys.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start,
               (allocator_type *)
               &secondHalfKey.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<float,_std::allocator<float>_>::operator=
              (&((parent->super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->keys,
               (vector<float,_std::allocator<float>_> *)local_168);
    std::vector<float,_std::allocator<float>_>::operator=
              ((vector<float,_std::allocator<float>_> *)
               &internalNode1Ptr.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi[1]._M_use_count,(vector<float,_std::allocator<float>_> *)local_120);
    std::vector<std::shared_ptr<void>,std::allocator<std::shared_ptr<void>>>::
    vector<__gnu_cxx::__normal_iterator<std::shared_ptr<void>const*,std::vector<std::shared_ptr<void>,std::allocator<std::shared_ptr<void>>>>,void>
              ((vector<std::shared_ptr<void>,std::allocator<std::shared_ptr<void>>> *)
               &secondHalfKey.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,
               (__normal_iterator<const_std::shared_ptr<void>_*,_std::vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>_>
                )secondHalfPtr.
                 super__Vector_base<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage,
               secondHalfPtr.
               super__Vector_base<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage + uVar3 + 1,
               (allocator_type *)
               &firstHalfPtr.
                super__Vector_base<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<std::shared_ptr<void>,std::allocator<std::shared_ptr<void>>>::
    vector<__gnu_cxx::__normal_iterator<std::shared_ptr<void>const*,std::vector<std::shared_ptr<void>,std::allocator<std::shared_ptr<void>>>>,void>
              ((vector<std::shared_ptr<void>,std::allocator<std::shared_ptr<void>>> *)
               &firstHalfPtr.
                super__Vector_base<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,
               secondHalfPtr.
               super__Vector_base<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage + uVar3 + 1,
               (__normal_iterator<const_std::shared_ptr<void>_*,_std::vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>_>
                )tempPtrs.
                 super__Vector_base<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>.
                 _M_impl.super__Vector_impl_data._M_start,
               (allocator_type *)
               &newPointer.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>::operator=
              (&((parent->super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->ptrs,
               (vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_> *)
               &secondHalfKey.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>::operator=
              ((vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_> *)
               internalNode1Ptr.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi,(vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_> *)
                     &firstHalfPtr.
                      super__Vector_base<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__shared_ptr<void,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<Node,void>
              ((__shared_ptr<void,(__gnu_cxx::_Lock_policy)2> *)
               &newPointer.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               &parent->super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>);
    std::__shared_ptr<void,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<Node,void>
              ((__shared_ptr<void,(__gnu_cxx::_Lock_policy)2> *)
               &tempPtrs.
                super__Vector_base<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,
               (__shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2> *)
               &internalNode1Ptr.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    newRoot.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
         *(float *)(CONCAT71(stack0xffffffffffffffa9,auStack_58[0]) + uVar3 * 4);
    this->numNodes = this->numNodes + 1;
    if ((parent->super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
        (this->root).super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr) {
      tempKeys.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._7_1_ = 0;
      std::make_shared<Node,bool,unsigned_int&>
                ((bool *)&newInternalNode.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount,
                 (uint *)((long)&tempKeys.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage + 7));
      this->numNodes = this->numNodes + 1;
      std::vector<float,_std::allocator<float>_>::push_back
                ((vector<float,_std::allocator<float>_> *)
                 &newInternalNode.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi[1]._M_use_count,
                 (value_type_conflict1 *)
                 ((long)&newRoot.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi + 4));
      std::vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>::push_back
                ((vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_> *)
                 newInternalNode.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi,(value_type *)
                       &newPointer.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
      ;
      std::vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>::push_back
                ((vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_> *)
                 newInternalNode.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi,(value_type *)
                       &tempPtrs.
                        super__Vector_base<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2> *)this,
                 (__shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2> *)
                 &newInternalNode.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      this_01 = &newRoot;
    }
    else {
      this_00 = &firstHalfKey.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      local_34 = newRoot.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
                 _4_4_;
      std::__shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2> *)this_00,
                 (__shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2> *)this);
      std::__shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2> *)((long)local_148 + 8),
                 &parent->super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>);
      FindParent((BPlusTree *)
                 &internalNode2Ptr.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 &this->root,(shared_ptr<Node> *)this_00);
      std::__shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_130,
                 (__shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2> *)
                 &internalNode1Ptr.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
      ;
      InsertInternal(this,local_34,
                     (shared_ptr<Node> *)
                     &internalNode2Ptr.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,(shared_ptr<Node> *)&local_130);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_130._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_138);
      this_01 = (shared_ptr<Node> *)local_148;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)this_01);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&internalNode2Ptr);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&internalNode1Ptr);
    std::vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>::~vector
              ((vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_> *)
               &firstHalfPtr.
                super__Vector_base<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>::~vector
              ((vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_> *)
               &secondHalfKey.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              ((_Vector_base<float,_std::allocator<float>_> *)local_120);
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              ((_Vector_base<float,_std::allocator<float>_> *)local_168);
    std::vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>::~vector
              ((vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_> *)
               &secondHalfPtr.
                super__Vector_base<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              ((_Vector_base<float,_std::allocator<float>_> *)auStack_58);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&newInternalNode);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&newPointer);
  return;
}

Assistant:

void BPlusTree::InsertInternal(float key, std::shared_ptr<Node> parent, std::shared_ptr<Node> child) {
    std::shared_ptr<void> newPointer(child);

    // parent still have space
    if (parent->keys.size() < size) {
        int insertPos = -1;
        for (int i = 0; i < parent->keys.size(); i++) {
            if (key < parent->keys[i]) {
                insertPos = i;
                break;
            }

            if (i == parent->keys.size()-1) {
                insertPos = parent->keys.size();
            }
        }

        if (insertPos != -1) {
            // insert key in vector
            std::vector<float>::iterator keyInsertItr = parent->keys.begin() + insertPos;
            parent->keys.insert(keyInsertItr, key);

            // insert ptr in vector
            std::vector<std::shared_ptr<void>>::iterator ptrInsertItr = parent->ptrs.begin() + insertPos + 1;
            parent->ptrs.insert(ptrInsertItr, newPointer);
        }
    } else {
        // parent does not have space, split the parent node into 2
        std::shared_ptr<Node> newInternalNode = std::make_shared<Node>(false, size);

        std::vector<float> tempKeys(parent->keys);
        std::vector<std::shared_ptr<void>> tempPtrs(parent->ptrs);

        // insert into temp key & ptr
        int insertPos = -1;
        for (int i = 0; i < tempKeys.size(); i++) {
            if (key < tempKeys[i]) {
                insertPos = i;
                break;
            }

            if (i == tempKeys.size()-1) {
                insertPos = tempKeys.size();
                break;
            }
        }

        if (insertPos != -1) {
            // insert key in vector
            std::vector<float>::iterator keyInsertItr = tempKeys.begin() + insertPos;
            tempKeys.insert(keyInsertItr, key);

            // insert ptr in vector
            std::vector<std::shared_ptr<void>>::iterator ptrInsertItr = tempPtrs.begin() + insertPos + 1;
            tempPtrs.insert(ptrInsertItr, newPointer);
        }

        // split temp key & ptr
        std::size_t splitSize = (tempKeys.size() + 1)/2;
        std::vector<float> firstHalfKey(tempKeys.cbegin(), tempKeys.cbegin() + splitSize);
        std::vector<float> secondHalfKey(tempKeys.cbegin() + splitSize + 1, tempKeys.cend());    // +1 becuase for the second half dont need the first key

        parent->keys = firstHalfKey;
        newInternalNode->keys = secondHalfKey;

        std::vector<std::shared_ptr<void>>::const_iterator splitIter(tempPtrs.cbegin());
        std::advance(splitIter, splitSize);

        std::vector<std::shared_ptr<void>> firstHalfPtr(tempPtrs.cbegin(), splitIter + 1);
        std::vector<std::shared_ptr<void>> secondHalfPtr(splitIter + 1, tempPtrs.cend());

        parent->ptrs = firstHalfPtr;
        newInternalNode->ptrs = secondHalfPtr;

        std::shared_ptr<void> internalNode1Ptr(parent);
        std::shared_ptr<void> internalNode2Ptr(newInternalNode);
        float newParentKey = tempKeys[splitSize];
        numNodes++;

        if (parent == root) {
            std::shared_ptr<Node> newRoot = std::make_shared<Node>(false, size);
            numNodes++;
            newRoot->keys.push_back(newParentKey);
            newRoot->ptrs.push_back(internalNode1Ptr);
            newRoot->ptrs.push_back(internalNode2Ptr);
            root = newRoot;
        } else {
            InsertInternal(newParentKey, FindParent(root, parent), newInternalNode);
        }
    }
}